

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

bool __thiscall units::looksLikeNumber(units *this,string *string,size_t index)

{
  units uVar1;
  
  if (index < string) {
    uVar1 = this[index];
    if ((byte)((char)uVar1 - 0x30U) < 10) {
      return true;
    }
    if ((string *)(index + 2) <= string) {
      if ((uVar1 == (units)0x2b) || (uVar1 == (units)0x2d)) {
        if ((byte)((char)this[index + 1] - 0x30U) < 10) {
          return true;
        }
        if (this[index + 1] != (units)0x2e || string < (string *)(index + 3)) {
          return false;
        }
        uVar1 = this[(long)(index + 2)];
      }
      else {
        if (uVar1 != (units)0x2e) {
          return false;
        }
        uVar1 = this[index + 1];
      }
      if ((byte)((char)uVar1 - 0x30U) < 10) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool looksLikeNumber(const std::string& string, size_t index)
{
    if (string.size() <= index) {
        return false;
    }
    if (isDigitCharacter(string[index])) {
        return true;
    }
    if (string.size() < index + 2) {
        return false;
    }
    if (string[index] == '.' &&
        (string[index + 1] >= '0' && string[index + 1] <= '9')) {
        return true;
    }
    if (string[index] == '-' || string[index] == '+') {
        if (string[index + 1] >= '0' && string[index + 1] <= '9') {
            return true;
        }
        if (string.size() >= index + 3 && string[index + 1] == '.' &&
            (string[index + 2] >= '0' && string[index + 2] <= '9')) {
            return true;
        }
    }
    return false;
}